

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O1

deInt32 __thiscall
sglr::ReferenceContext::getAttribLocation(ReferenceContext *this,deUint32 program,char *name)

{
  pointer pbVar1;
  long *__s2;
  int iVar2;
  ShaderProgramObjectContainer *pSVar3;
  size_t sVar4;
  size_type *psVar5;
  long lVar6;
  char *pcVar7;
  bool bVar8;
  string nameString;
  long *local_50;
  size_t local_48;
  long local_40 [2];
  
  pSVar3 = rc::ObjectManager<sglr::rc::ShaderProgramObjectContainer>::find
                     (&this->m_programs,program);
  if (pSVar3 == (ShaderProgramObjectContainer *)0x0) {
    if (this->m_lastError == 0) {
      this->m_lastError = 0x502;
    }
  }
  else if (name != (char *)0x0) {
    local_50 = local_40;
    sVar4 = strlen(name);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,name,name + sVar4);
    __s2 = local_50;
    pbVar1 = (pSVar3->m_program->m_attributeNames).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar6 = (long)(pSVar3->m_program->m_attributeNames).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1;
    bVar8 = lVar6 != 0;
    if (bVar8) {
      pcVar7 = (char *)(lVar6 >> 5);
      psVar5 = &pbVar1->_M_string_length;
      name = (char *)0x0;
      do {
        sVar4 = *psVar5;
        if ((sVar4 == local_48) &&
           ((sVar4 == 0 ||
            (iVar2 = bcmp((((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           (psVar5 + -1))->_M_dataplus)._M_p,__s2,sVar4), iVar2 == 0)))) break;
        name = name + 1;
        bVar8 = name < pcVar7;
        psVar5 = psVar5 + 4;
      } while (pcVar7 + (pcVar7 == (char *)0x0) != name);
    }
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
    if (bVar8) {
      return (deInt32)name;
    }
  }
  return -1;
}

Assistant:

deInt32 ReferenceContext::getAttribLocation (deUint32 program, const char *name)
{
	ShaderProgramObjectContainer* shaderProg = m_programs.find(program);

	RC_IF_ERROR(shaderProg == DE_NULL, GL_INVALID_OPERATION, -1);

	if (name)
	{
		std::string nameString(name);

		for (size_t ndx = 0; ndx < shaderProg->m_program->m_attributeNames.size(); ++ndx)
			if (shaderProg->m_program->m_attributeNames[ndx] == nameString)
				return (int)ndx;
	}

	return -1;
}